

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_socket(int domain,int protocol)

{
  ushort uVar1;
  _func_void *p_Var2;
  nn_socktype *socktype;
  int iVar3;
  long lVar4;
  char *pcVar5;
  nn_sock **ppnVar6;
  int *piVar7;
  nn_socktype **ppnVar8;
  nn_sock *self;
  short sVar9;
  nn_transport **ppnVar10;
  
  nn_do_once(&once,nn_lib_init);
  nn_mutex_lock(&::self.lock);
  if ((::self.flags & 3U) == 0) {
    if (::self.socks == (nn_sock **)0x0) {
      nn_alloc_init();
      nn_random_seed();
      ::self.socks = (nn_sock **)nn_alloc_(0x1400);
      if (::self.socks == (nn_sock **)0x0) {
        nn_backtrace_print();
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/global.c"
                ,0xef);
        fflush(_stderr);
        nn_err_abort();
      }
      for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
        ::self.socks[lVar4] = (nn_sock *)0x0;
      }
      ::self.nsocks = 0;
      ::self.flags = 0;
      pcVar5 = getenv("NN_PRINT_ERRORS");
      ::self.print_errors = 0;
      if (pcVar5 != (char *)0x0) {
        ::self.print_errors = (int)(*pcVar5 != '\0');
      }
      ppnVar6 = ::self.socks + 0x200;
      sVar9 = 0x1ff;
      ::self.unused = (uint16_t *)ppnVar6;
      for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
        *(short *)((long)ppnVar6 + lVar4 * 2) = sVar9;
        sVar9 = sVar9 + -1;
      }
      for (ppnVar10 = nn_transports; *ppnVar10 != (nn_transport *)0x0; ppnVar10 = ppnVar10 + 1) {
        p_Var2 = (*ppnVar10)->init;
        if (p_Var2 != (_func_void *)0x0) {
          (*p_Var2)();
        }
      }
      nn_pool_init(&::self.pool);
    }
    if (domain - 3U < 0xfffffffe) {
      iVar3 = -0x61;
    }
    else if (::self.nsocks < 0x200) {
      uVar1 = *(ushort *)((long)::self.unused + (ulong)(uint)((0x1ff - (int)::self.nsocks) * 2));
      iVar3 = -0x16;
      for (ppnVar8 = nn_socktypes; socktype = *ppnVar8, socktype != (nn_socktype *)0x0;
          ppnVar8 = ppnVar8 + 1) {
        if ((socktype->domain == domain) && (socktype->protocol == protocol)) {
          self = (nn_sock *)nn_alloc_(0x250);
          if (self == (nn_sock *)0x0) {
            iVar3 = -0xc;
          }
          else {
            iVar3 = nn_sock_init(self,socktype,(uint)uVar1);
            if (-1 < iVar3) {
              ::self.socks[uVar1] = self;
              ::self.nsocks = ::self.nsocks + 1;
              nn_mutex_unlock(&::self.lock);
              return (uint)uVar1;
            }
          }
          break;
        }
      }
    }
    else {
      iVar3 = -0x18;
    }
    nn_global_term();
    nn_mutex_unlock(&::self.lock);
    piVar7 = __errno_location();
    *piVar7 = -iVar3;
  }
  else {
    nn_mutex_unlock(&::self.lock);
    piVar7 = __errno_location();
    *piVar7 = 0x9523dfd;
  }
  return -1;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_do_once (&once, nn_lib_init);

    nn_mutex_lock (&self.lock);

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_TERM)) {
        nn_mutex_unlock (&self.lock);
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_mutex_unlock (&self.lock);
        errno = -rc;
        return -1;
    }

    nn_mutex_unlock (&self.lock);

    return rc;
}